

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmSystemToolsFileTime *t;
  size_t sVar7;
  pointer pbVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  bool changed;
  string emsg;
  ostringstream e;
  bool local_229;
  cmCommand *local_228;
  pointer local_220;
  string local_218;
  pointer local_1f8;
  pointer local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar9 = 0;
  local_228 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) {
    local_1f0 = (char *)0x0;
    local_220 = (pointer)0x0;
    local_1f8 = (char *)0x0;
  }
  else {
    uVar11 = 1;
    uVar10 = 2;
    local_1f8 = (pointer)0x0;
    local_220 = (pointer)0x0;
    local_1f0 = (pointer)0x0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)(pbVar8 + uVar11));
      if (iVar6 == 0) {
        iVar9 = 2;
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar11));
        if (iVar6 == 0) {
          iVar9 = 3;
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar11));
          if (iVar6 == 0) {
            iVar9 = 1;
          }
          else {
            if (iVar9 == 3) {
              local_220 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p;
            }
            else if (iVar9 == 2) {
              local_1f0 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p;
            }
            else {
              if (iVar9 != 1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"RPATH_CHANGE given unknown argument ",0x24);
                pbVar8 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pbVar8[uVar11]._M_dataplus._M_p,
                           pbVar8[uVar11]._M_string_length);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(local_228,&local_218);
                goto LAB_0035f263;
              }
              local_1f8 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p;
            }
            iVar9 = 0;
          }
        }
      }
      uVar11 = (ulong)uVar10;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar10 + 1;
    } while (uVar11 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
            );
  }
  pcVar3 = local_1f0;
  pcVar2 = local_1f8;
  if (local_1f8 == (char *)0x0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"RPATH_CHANGE not given FILE option.","");
    cmCommand::SetError(local_228,(string *)local_1a8);
LAB_0035f163:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  if (local_1f0 == (char *)0x0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"RPATH_CHANGE not given OLD_RPATH option.","");
    cmCommand::SetError(local_228,(string *)local_1a8);
    goto LAB_0035f163;
  }
  if (local_220 == (pointer)0x0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"RPATH_CHANGE not given NEW_RPATH option.","");
    cmCommand::SetError(local_228,(string *)local_1a8);
    goto LAB_0035f163;
  }
  bVar4 = cmsys::SystemTools::FileExists(local_1f8,true);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"RPATH_CHANGE given FILE \"",0x19);
    sVar7 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\" that does not exist.",0x16);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(local_228,&local_218);
LAB_0035f263:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                               local_218.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return false;
  }
  t = cmSystemTools::FileTimeNew();
  bVar4 = cmSystemTools::FileTimeGet(pcVar2,t);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1a8._0_8_ = local_1a8 + 0x10;
  sVar7 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar2,pcVar2 + sVar7);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  sVar7 = strlen(pcVar3);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pcVar3,pcVar3 + sVar7);
  pcVar2 = local_220;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  sVar7 = strlen(local_220);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar2,pcVar2 + sVar7);
  bVar5 = cmSystemTools::ChangeRPath
                    ((string *)local_1a8,&local_1e8,&local_1c8,&local_218,&local_229);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_1f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (!bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"RPATH_CHANGE could not write new RPATH:\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    pcVar3 = local_220;
    sVar7 = strlen(local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"to the file:\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    sVar7 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(local_228,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (!bVar5) goto LAB_0035f087;
  }
  if (local_229 == true) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Set runtime path of \"","")
    ;
    std::__cxx11::string::append(local_1a8);
    std::__cxx11::string::append(local_1a8);
    std::__cxx11::string::append(local_1a8);
    std::__cxx11::string::append(local_1a8);
    cmMakefile::DisplayStatus(local_228->Makefile,(char *)local_1a8._0_8_,-1.0);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if (bVar4) {
    cmSystemTools::FileTimeSet(pcVar2,t);
  }
LAB_0035f087:
  cmSystemTools::FileTimeDelete(t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,
                    CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                             local_218.field_2._M_local_buf[0]) + 1);
    return bVar5;
  }
  return bVar5;
}

Assistant:

bool
cmFileCommand::HandleRPathChangeCommand(std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = 0;
  const char* oldRPath = 0;
  const char* newRPath = 0;
  enum Doing { DoingNone, DoingFile, DoingOld, DoingNew };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "OLD_RPATH")
      {
      doing = DoingOld;
      }
    else if(args[i] == "NEW_RPATH")
      {
      doing = DoingNew;
      }
    else if(args[i] == "FILE")
      {
      doing = DoingFile;
      }
    else if(doing == DoingFile)
      {
      file = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingOld)
      {
      oldRPath = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingNew)
      {
      newRPath = args[i].c_str();
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }
  if(!file)
    {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
    }
  if(!oldRPath)
    {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
    }
  if(!newRPath)
    {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
    }
  if(!cmSystemTools::FileExists(file, true))
    {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
    }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool changed;
  if(!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed))
    {
    std::ostringstream e;
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    this->SetError(e.str());
    success = false;
    }
  if(success)
    {
    if(changed)
      {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    if(have_ft)
      {
      cmSystemTools::FileTimeSet(file, ft);
      }
    }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}